

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O3

void cleanup_player_prop(void)

{
  player_ability *ppVar1;
  player_ability *totrash;
  player_ability *p;
  
  p = player_abilities;
  if (player_abilities != (player_ability *)0x0) {
    do {
      ppVar1 = p->next;
      string_free(p->type);
      string_free(p->desc);
      string_free(p->name);
      mem_free(p);
      p = ppVar1;
    } while (ppVar1 != (player_ability *)0x0);
  }
  return;
}

Assistant:

static void cleanup_player_prop(void)
{
	struct player_ability *ability = player_abilities;
	while (ability) {
		struct player_ability *totrash = ability;
		ability = ability->next;
		string_free(totrash->type);
		string_free(totrash->desc);
		string_free(totrash->name);
		mem_free(totrash);
	}
}